

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

void __thiscall duckdb::ClientContext::~ClientContext(ClientContext *this)

{
  _Atomic_word *p_Var1;
  get_result_collector_t *pgVar2;
  _Head_base<0UL,_duckdb::ActiveQueryContext_*,_false> __ptr;
  _Head_base<0UL,_duckdb::ClientData_*,_false> this_00;
  pointer pcVar3;
  _Manager_type p_Var4;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  bool bVar7;
  int iVar8;
  
  bVar7 = Exception::UncaughtException();
  if (!bVar7) {
    Destroy(this);
  }
  __ptr._M_head_impl =
       (this->active_query).
       super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
       .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (ActiveQueryContext *)0x0) {
    ::std::default_delete<duckdb::ActiveQueryContext>::operator()
              ((default_delete<duckdb::ActiveQueryContext> *)&this->active_query,__ptr._M_head_impl)
    ;
  }
  (this->active_query).
  super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
  .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl =
       (ActiveQueryContext *)0x0;
  TransactionContext::~TransactionContext(&this->transaction);
  this_00._M_head_impl =
       (this->client_data).
       super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
       super___uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
       super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (ClientData *)0x0) {
    ClientData::~ClientData(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  (this->client_data).super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>
  ._M_t.super___uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
  super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl = (ClientData *)0x0;
  pcVar3 = (this->config).http_logging_output._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->config).http_logging_output.field_2) {
    operator_delete(pcVar3);
  }
  p_Var4 = (this->config).result_collector.super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    pgVar2 = &(this->config).result_collector;
    (*p_Var4)((_Any_data *)pgVar2,(_Any_data *)pgVar2,__destroy_functor);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->config).user_variables._M_h);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->config).set_variables._M_h);
  ::std::
  _Hashtable<duckdb::MetricsType,_duckdb::MetricsType,_std::allocator<duckdb::MetricsType>,_std::__detail::_Identity,_std::equal_to<duckdb::MetricsType>,_duckdb::MetricsTypeHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->config).profiler_settings._M_h);
  pcVar3 = (this->config).profiler_save_location._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->config).profiler_save_location.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->config).home_directory._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->config).home_directory.field_2) {
    operator_delete(pcVar3);
  }
  _Var5._M_head_impl =
       (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (Logger *)0x0) {
    (**(code **)((long)(_Var5._M_head_impl)->_vptr_Logger + 8))();
  }
  (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = (Logger *)0x0;
  ::std::
  unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>::
  ~unique_ptr(&(this->registered_state).
               super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
             );
  p_Var6 = (this->db).internal.
           super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  p_Var6 = (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var6->_M_weak_count;
      iVar8 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar8 = p_Var6->_M_weak_count;
      p_Var6->_M_weak_count = iVar8 + -1;
    }
    if (iVar8 == 1) {
      (*p_Var6->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

ClientContext::~ClientContext() {
	if (Exception::UncaughtException()) {
		return;
	}
	// destroy the client context and rollback if there is an active transaction
	// but only if we are not destroying this client context as part of an exception stack unwind
	Destroy();
}